

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O1

bool __thiscall flatbuffers::lobster::LobsterGenerator::generate(LobsterGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  Parser *pPVar4;
  long *plVar5;
  size_type *psVar6;
  pointer ppEVar7;
  pointer ppSVar8;
  string code;
  string local_a8;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"// ","");
  BaseGenerator::FlatBuffersGeneratedWarning();
  plVar3 = (long *)std::__cxx11::string::append((char *)local_48);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
    local_68 = (long *)*plVar3;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  paVar1 = &local_a8.field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_a8.field_2._M_allocated_capacity = *psVar6;
    local_a8.field_2._8_8_ = plVar3[3];
    local_a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar6;
    local_a8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_a8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  pPVar4 = (this->super_BaseGenerator).parser_;
  ppEVar7 = (pPVar4->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar7 !=
      (pPVar4->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      GenEnum(this,*ppEVar7,&local_88);
      ppEVar7 = ppEVar7 + 1;
      pPVar4 = (this->super_BaseGenerator).parser_;
    } while (ppEVar7 !=
             (pPVar4->enums_).vec.
             super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  ppSVar8 = (pPVar4->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (this->super_BaseGenerator).parser_;
  if (ppSVar8 !=
      (pPVar4->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      GenStructPreDecl(this,*ppSVar8,&local_88);
      ppSVar8 = ppSVar8 + 1;
      pPVar4 = (this->super_BaseGenerator).parser_;
    } while (ppSVar8 !=
             (pPVar4->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppSVar8 = (pPVar4->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (this->super_BaseGenerator).parser_;
  if (ppSVar8 !=
      (pPVar4->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      GenStruct(this,*ppSVar8,&local_88);
      ppSVar8 = ppSVar8 + 1;
      pPVar4 = (this->super_BaseGenerator).parser_;
    } while (ppSVar8 !=
             (pPVar4->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  BaseGenerator::GeneratedFileName
            (&local_a8,&this->super_BaseGenerator,(this->super_BaseGenerator).path_,
             (this->super_BaseGenerator).file_name_,&pPVar4->opts);
  bVar2 = SaveFile(local_a8._M_dataplus._M_p,local_88._M_dataplus._M_p,local_88._M_string_length,
                   false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool generate() {
    std::string code;
    code += std::string("// ") + FlatBuffersGeneratedWarning() +
            "\nimport flatbuffers\n\n";
    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      auto &enum_def = **it;
      GenEnum(enum_def, &code);
    }
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      auto &struct_def = **it;
      GenStructPreDecl(struct_def, &code);
    }
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      auto &struct_def = **it;
      GenStruct(struct_def, &code);
    }
    return SaveFile(GeneratedFileName(path_, file_name_, parser_.opts).c_str(),
                    code, false);
  }